

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

shared_ptr<aeron::Counter> __thiscall
aeron::ClientConductor::findCounter(ClientConductor *this,int64_t registrationId)

{
  undefined4 uVar1;
  SourcedException *pSVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar3 [16];
  int iVar4;
  long *plVar5;
  SourcedException *pSVar6;
  char *pcVar7;
  _func_int **pp_Var8;
  size_type in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar9;
  SourcedException *pSVar10;
  SourcedException *unaff_R15;
  shared_ptr<aeron::Counter> sVar11;
  undefined1 auVar12 [16];
  allocator local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)(registrationId + 8));
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
    goto LAB_0016141d;
  }
  pSVar6 = *(SourcedException **)(registrationId + 0x78);
  pSVar2 = *(SourcedException **)(registrationId + 0x80);
  lVar9 = ((long)pSVar2 - (long)pSVar6 >> 5) * -0x5555555555555555 >> 2;
  pSVar10 = pSVar6;
  if (0 < lVar9) {
    pSVar10 = (SourcedException *)(lVar9 * 0x180 + (long)pSVar6);
    lVar9 = lVar9 + 1;
    unaff_R15 = (SourcedException *)&pSVar6[2].m_what._M_string_length;
    do {
      if (unaff_R15[-3].m_where.field_2._M_allocated_capacity == in_RDX) {
        unaff_R15 = (SourcedException *)&unaff_R15[-3].m_where.field_2;
        goto LAB_001612f9;
      }
      if (unaff_R15[-2].m_what._M_string_length == in_RDX) {
        unaff_R15 = (SourcedException *)&unaff_R15[-2].m_what._M_string_length;
        goto LAB_001612f9;
      }
      if (*(size_type *)unaff_R15 == in_RDX) goto LAB_001612f9;
      if (unaff_R15[1].m_where.field_2._M_allocated_capacity == in_RDX) {
        unaff_R15 = (SourcedException *)&unaff_R15[1].m_where.field_2;
        goto LAB_001612f9;
      }
      lVar9 = lVar9 + -1;
      unaff_R15 = (SourcedException *)&unaff_R15[5].m_where.field_2;
    } while (1 < lVar9);
  }
  lVar9 = ((long)pSVar2 - (long)pSVar10 >> 5) * -0x5555555555555555;
  if (lVar9 == 1) {
LAB_001612da:
    unaff_R15 = pSVar10;
    if (*(size_type *)pSVar10 != in_RDX) {
      unaff_R15 = pSVar2;
    }
  }
  else if (lVar9 == 2) {
LAB_001612d1:
    unaff_R15 = pSVar10;
    if (*(size_type *)pSVar10 != in_RDX) {
      pSVar10 = (SourcedException *)&pSVar10[1].m_where.field_2;
      goto LAB_001612da;
    }
  }
  else {
    unaff_R15 = pSVar2;
    if ((lVar9 == 3) && (unaff_R15 = pSVar10, *(size_type *)pSVar10 != in_RDX)) {
      pSVar10 = (SourcedException *)&pSVar10[1].m_where.field_2;
      goto LAB_001612d1;
    }
  }
LAB_001612f9:
  if (unaff_R15 == pSVar2) {
    this->_vptr_ClientConductor = (_func_int **)0x0;
    (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = 0;
LAB_001613f9:
    pthread_mutex_unlock((pthread_mutex_t *)(registrationId + 8));
    sVar11.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar11.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<aeron::Counter>)
           sVar11.super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2> *)this,&unaff_R15[1].m_where)
  ;
  if (*(long *)((long)&(unaff_R15->m_what).field_2 + 8) != 0) {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(unaff_R15 + 1);
    *(undefined8 *)((long)&(unaff_R15->m_what).field_2 + 8) = 0;
    *(long *)(unaff_R15 + 1) = 0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  pp_Var8 = this->_vptr_ClientConductor;
  iVar4 = *(int *)&(unaff_R15->m_where).field_2;
  if ((pp_Var8 != (_func_int **)0x0) || (iVar4 != 0)) {
    if ((pp_Var8 == (_func_int **)0x0) && (iVar4 == 2)) {
LAB_0016141d:
      pSVar6 = (SourcedException *)__cxa_allocate_exception(0x50);
      uVar1 = *(undefined4 *)((long)&(unaff_R15->m_where).field_2 + 4);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "std::shared_ptr<Counter> aeron::ClientConductor::findCounter(std::int64_t)","");
      pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                                );
      std::__cxx11::string::string((string *)&local_b0,pcVar7,(allocator *)&local_70);
      util::SourcedException::SourcedException
                (pSVar6,(string *)((long)&(unaff_R15->m_where).field_2 + 8),&local_d0,&local_b0,
                 0x176);
      *(undefined ***)pSVar6 = &PTR__SourcedException_00188980;
      *(undefined4 *)(pSVar6 + 1) = uVar1;
      __cxa_throw(pSVar6,&util::RegistrationException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    goto LAB_001613f9;
  }
  if (*(long *)(registrationId + 0x1e8) == 0) {
    auVar12 = std::__throw_bad_function_call();
  }
  else {
    lVar9 = (**(code **)(registrationId + 0x1f0))(registrationId + 0x1d8);
    if (lVar9 <= (long)(*(long *)(registrationId + 0x210) + (unaff_R15->m_where)._M_string_length))
    goto LAB_001613f9;
    unaff_R15 = (SourcedException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_70,*(long *)(registrationId + 0x210));
    std::operator+(&local_b0,"no response from driver in ",&local_70);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    auVar3._8_8_ = &local_d0.field_2;
    auVar3._0_8_ = plVar5;
    auVar12._8_8_ = (_func_int **)*plVar5;
    auVar12._0_8_ = plVar5;
    pp_Var8 = (_func_int **)(plVar5 + 2);
    if ((_func_int **)*plVar5 == pp_Var8) {
      local_d0.field_2._M_allocated_capacity = (size_type)*pp_Var8;
      local_d0.field_2._8_4_ = (undefined4)plVar5[3];
      local_d0.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
      auVar12 = auVar3;
      goto LAB_001614d8;
    }
  }
  local_d0.field_2._M_allocated_capacity = (size_type)*pp_Var8;
LAB_001614d8:
  local_d0._M_dataplus._M_p = auVar12._8_8_;
  plVar5 = auVar12._0_8_;
  local_d0._M_string_length = plVar5[1];
  *plVar5 = (long)pp_Var8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "std::shared_ptr<Counter> aeron::ClientConductor::findCounter(std::int64_t)","");
  pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                            );
  std::__cxx11::string::string((string *)&local_50,pcVar7,&local_d1);
  util::SourcedException::SourcedException(unaff_R15,&local_d0,&local_90,&local_50,0x171);
  *(undefined ***)unaff_R15 = &PTR__SourcedException_001886f0;
  __cxa_throw(unaff_R15,&util::DriverTimeoutException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

std::shared_ptr<Counter> ClientConductor::findCounter(std::int64_t registrationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(
        m_counters.begin(),
        m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it == m_counters.end())
    {
        return std::shared_ptr<Counter>();
    }

    CounterStateDefn& state = *it;
    std::shared_ptr<Counter> counter = state.m_counter.lock();

    if (state.m_counterCache)
    {
        state.m_counterCache.reset();
    }

    if (!counter && RegistrationStatus::AWAITING_MEDIA_DRIVER == state.m_status)
    {
        if (m_epochClock() > (state.m_timeOfRegistration + m_driverTimeoutMs))
        {
            throw DriverTimeoutException(
                "no response from driver in " + std::to_string(m_driverTimeoutMs) + " ms", SOURCEINFO);
        }
    }
    else if (!counter && RegistrationStatus::ERRORED_MEDIA_DRIVER == state.m_status)
    {
        throw RegistrationException(state.m_errorCode, state.m_errorMessage, SOURCEINFO);
    }

    return counter;
}